

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int32 iVar1;
  int iVar2;
  cmd_ln_t *pcVar3;
  char *pcVar4;
  char **accum_dirs;
  long ln;
  err_lvl_t lvl;
  uint32 n_gau;
  uint32 n_feat;
  uint32 n_mixw;
  uint32 local_5c;
  float32 ***mixw_acc_in;
  float32 ***mixw_acc_b;
  float32 ***mixw_acc_a;
  model_def_t *mdef;
  float32 ***mixw;
  
  parse_cmd_ln(argc,argv);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-moddeffn");
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "No moddeffn specified, exiting";
    lvl = ERR_ERROR;
    ln = 0x21f;
  }
  else {
    pcVar3 = cmd_ln_get();
    pcVar4 = cmd_ln_str_r(pcVar3,"-moddeffn");
    iVar1 = model_def_read(&mdef,pcVar4);
    if (iVar1 != 0) goto LAB_001036d3;
    local_5c = 0;
    pcVar3 = cmd_ln_get();
    accum_dirs = cmd_ln_str_list_r(pcVar3,"-accumdirs");
    if (*accum_dirs == (char *)0x0) {
      __assert_fail("accum_dir[i] != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                    ,0x22c,"int rd_interp_wr()");
    }
    rd_param(&local_5c,accum_dirs,&mixw_acc_a,&n_mixw,&n_feat,&n_gau);
    if (accum_dirs[local_5c] == (char *)0x0) {
      __assert_fail("accum_dir[i] != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                    ,0x230,"int rd_interp_wr()");
    }
    rd_param(&local_5c,accum_dirs,&mixw_acc_b,&n_mixw,&n_feat,&n_gau);
    while (accum_dirs[local_5c] != (char *)0x0) {
      rd_param(&local_5c,accum_dirs,&mixw_acc_in,&n_mixw,&n_feat,&n_gau);
      accum_param(mixw_acc_a,mixw_acc_in,n_mixw,n_feat,n_gau);
      ckd_free_3d(mixw_acc_in);
      if (accum_dirs[local_5c] == (char *)0x0) {
        __assert_fail("accum_dir[i] != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                      ,0x23f,"int rd_interp_wr()");
      }
      rd_param(&local_5c,accum_dirs,&mixw_acc_in,&n_mixw,&n_feat,&n_gau);
      accum_param(mixw_acc_b,mixw_acc_in,n_mixw,n_feat,n_gau);
      ckd_free_3d(mixw_acc_in);
    }
    smooth_mixw(&mixw,mixw_acc_a,mixw_acc_b,n_mixw,n_feat,n_gau,mdef);
    iVar2 = wr_param(mixw,n_mixw,n_feat,n_gau);
    if (iVar2 == 0) {
      return 0;
    }
    pcVar4 = "Error writing parameters\n";
    lvl = ERR_FATAL;
    ln = 0x255;
  }
  err_msg(lvl,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
          ,ln,pcVar4);
LAB_001036d3:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
    parse_cmd_ln(argc, argv);

    if (rd_interp_wr() != S3_SUCCESS)
	exit(1);
    
    return 0;
}